

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O0

int rsa_alt_check_pair(void *pub,void *prv)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sStack_450;
  int ret;
  size_t sig_len;
  uchar hash [32];
  uchar sig [1024];
  void *prv_local;
  void *pub_local;
  
  sStack_450 = 0;
  sVar2 = rsa_alt_get_bitlen(prv);
  sVar3 = rsa_get_bitlen(pub);
  if (sVar2 == sVar3) {
    memset(&sig_len,0x2a,0x20);
    pub_local._4_4_ =
         rsa_alt_sign_wrap(prv,MBEDTLS_MD_NONE,(uchar *)&sig_len,0x20,hash + 0x18,
                           &stack0xfffffffffffffbb0,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,
                           (void *)0x0);
    if (pub_local._4_4_ == 0) {
      iVar1 = rsa_verify_wrap(pub,MBEDTLS_MD_NONE,(uchar *)&sig_len,0x20,hash + 0x18,sStack_450);
      if (iVar1 == 0) {
        pub_local._4_4_ = 0;
      }
      else {
        pub_local._4_4_ = -0x4200;
      }
    }
  }
  else {
    pub_local._4_4_ = -0x4200;
  }
  return pub_local._4_4_;
}

Assistant:

static int rsa_alt_check_pair( const void *pub, const void *prv )
{
    unsigned char sig[MBEDTLS_MPI_MAX_SIZE];
    unsigned char hash[32];
    size_t sig_len = 0;
    int ret;

    if( rsa_alt_get_bitlen( prv ) != rsa_get_bitlen( pub ) )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );

    memset( hash, 0x2a, sizeof( hash ) );

    if( ( ret = rsa_alt_sign_wrap( (void *) prv, MBEDTLS_MD_NONE,
                                   hash, sizeof( hash ),
                                   sig, &sig_len, NULL, NULL ) ) != 0 )
    {
        return( ret );
    }

    if( rsa_verify_wrap( (void *) pub, MBEDTLS_MD_NONE,
                         hash, sizeof( hash ), sig, sig_len ) != 0 )
    {
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );
    }

    return( 0 );
}